

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

objc_protocol_method_description *
get_method_description(Protocol *p,SEL aSel,BOOL isRequiredMethod,BOOL isInstanceMethod)

{
  BOOL BVar1;
  objc_protocol_method_description_list *l;
  objc_protocol_method_description *poVar2;
  SEL s;
  int i;
  objc_protocol_method_description_list *list;
  BOOL isInstanceMethod_local;
  BOOL isRequiredMethod_local;
  SEL aSel_local;
  Protocol *p_local;
  
  l = get_method_list(p,isRequiredMethod,isInstanceMethod);
  if (l != (objc_protocol_method_description_list *)0x0) {
    for (s._4_4_ = 0; s._4_4_ < l->count; s._4_4_ = s._4_4_ + 1) {
      poVar2 = protocol_method_at_index(l,s._4_4_);
      BVar1 = sel_isEqual(poVar2->selector,aSel);
      if (BVar1 != '\0') {
        poVar2 = protocol_method_at_index(l,s._4_4_);
        return poVar2;
      }
    }
  }
  return (objc_protocol_method_description *)0x0;
}

Assistant:

static struct objc_protocol_method_description *
get_method_description(Protocol *p,
                       SEL aSel,
                       BOOL isRequiredMethod,
                       BOOL isInstanceMethod)
{
	struct objc_protocol_method_description_list *list =
		get_method_list(p, isRequiredMethod, isInstanceMethod);
	if (NULL == list)
	{
		return NULL;
	}
	for (int i=0 ; i<list->count ; i++)
	{
		SEL s = protocol_method_at_index(list, i)->selector;
		if (sel_isEqual(s, aSel))
		{
			return protocol_method_at_index(list, i);
		}
	}
	return NULL;
}